

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O2

void __thiscall
sglr::GLContext::copyTexSubImage3D
          (GLContext *this,deUint32 target,int level,int xoffset,int yoffset,int zoffset,int x,int y
          ,int width,int height)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  int iVar2;
  int iVar3;
  Enum<int,_2UL> local_1c0;
  MessageBuilder local_1b0;
  
  if ((this->m_logFlags & 1) != 0) {
    local_1b0.m_log = this->m_log;
    this_00 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"glCopyTexSubImage3D(");
    local_1c0.m_getName = glu::getTextureTargetName;
    local_1c0.m_value = target;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,level);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,xoffset);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,yoffset);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,zoffset);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,x);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,y);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,width);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,height);
    std::operator<<((ostream *)this_00,")");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  iVar2 = 0;
  iVar3 = 0;
  if (this->m_readFramebufferBinding == 0) {
    iVar2 = (this->m_baseViewport).m_data[0];
    iVar3 = (this->m_baseViewport).m_data[1];
  }
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x368))
            (target,level,xoffset,yoffset,zoffset,iVar2 + x,iVar3 + y,width,height);
  return;
}

Assistant:

void GLContext::copyTexSubImage3D (deUint32 target, int level, int xoffset, int yoffset, int zoffset, int x, int y, int width, int height)
{
	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glCopyTexSubImage3D("
								  << glu::getTextureTargetStr(target) << ", "
								  << level
								  << ", " << xoffset << ", " << yoffset << ", " << zoffset << ", "
								  << x << ", " << y << ", "
								  << width << ", " << height << ")"
			  << TestLog::EndMessage;

	tcu::IVec2 offset = getReadOffset();
	m_context.getFunctions().copyTexSubImage3D(target, level, xoffset, yoffset, zoffset, offset.x()+x, offset.y()+y, width, height);
}